

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eset.c
# Opt level: O3

edata_t * duckdb_je_eset_fit(eset_t *eset,size_t esize,size_t alignment,_Bool exact_only,
                            uint lg_max_fit)

{
  long lVar1;
  _Bool _Var2;
  ulong uVar3;
  size_t sVar4;
  edata_t *peVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint64_t uVar14;
  fb_group_t fVar15;
  ulong uVar16;
  
  uVar3 = alignment + 0xfff & 0xfffffffffffff000;
  uVar16 = (esize - 0x1000) + uVar3;
  if (uVar16 < esize) {
    return (edata_t *)0x0;
  }
  sVar4 = duckdb_je_sz_psz_quantize_ceil(uVar16);
  if (sVar4 < 0x7000000000000001) {
    uVar10 = sVar4 - 1;
    if (uVar10 == 0) {
      uVar8 = 0x40;
    }
    else {
      lVar1 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar8 = (uint)lVar1 ^ 0x3f;
    }
    iVar13 = 0x32 - uVar8;
    if (0x32 < uVar8) {
      iVar13 = 0;
    }
    bVar7 = 0xc;
    if (0x4000 < sVar4) {
      bVar7 = (char)iVar13 + 0xb;
    }
    uVar10 = (ulong)(((uint)(uVar10 >> (bVar7 & 0x3f)) & 3) + iVar13 * 4);
  }
  else {
    uVar10 = 199;
  }
  if (exact_only) {
    _Var2 = duckdb_je_edata_heap_empty(&eset->bins[uVar10].heap);
    if (!_Var2) {
      peVar5 = duckdb_je_edata_heap_first(&eset->bins[uVar10].heap);
      goto LAB_011742a0;
    }
  }
  else {
    uVar6 = uVar10 >> 6;
    uVar10 = (eset->bitmap[uVar6] >> ((byte)uVar10 & 0x3f)) << ((byte)uVar10 & 0x3f);
    if (uVar10 == 0) {
      peVar5 = (edata_t *)0x0;
      do {
        if (uVar6 == 3) goto LAB_011742a0;
        uVar10 = eset->bitmap[uVar6 + 1];
        uVar6 = uVar6 + 1;
      } while (uVar10 == 0);
    }
    uVar11 = 0;
    if (uVar10 != 0) {
      for (; (uVar10 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
      }
    }
    uVar11 = uVar6 << 6 | uVar11;
    uVar10 = uVar11 & 0xffffffff;
    if (uVar10 < 200) {
      uVar6 = 0;
      uVar14 = 0;
      peVar5 = (edata_t *)0x0;
      while( true ) {
        if (lg_max_fit == 0x40) {
          lg_max_fit = 0x3f;
        }
        if (uVar16 < duckdb_je_sz_pind2sz_tab[uVar11 & 0xffffffff] >> ((byte)lg_max_fit & 0x3f))
        break;
        if ((peVar5 == (edata_t *)0x0) ||
           (uVar11 = eset->bins[uVar10].heap_min.sn,
           (int)(((uint)(uVar14 < uVar11) - (uint)(uVar11 < uVar14)) * 2 -
                (uint)(eset->bins[uVar10].heap_min.addr < uVar6)) < 0)) {
          peVar5 = duckdb_je_edata_heap_first(&eset->bins[uVar10].heap);
          uVar14 = eset->bins[uVar10].heap_min.sn;
          uVar6 = eset->bins[uVar10].heap_min.addr;
        }
        if (uVar10 == 199) break;
        uVar12 = uVar10 + 1 >> 6;
        bVar7 = (byte)(uVar10 + 1);
        fVar15 = (eset->bitmap[uVar12] >> (bVar7 & 0x3f)) << (bVar7 & 0x3f);
        while (fVar15 == 0) {
          if (uVar12 == 3) goto LAB_011742a0;
          lVar1 = uVar12 + 1;
          uVar12 = uVar12 + 1;
          fVar15 = eset->bitmap[lVar1];
        }
        uVar11 = 0;
        if (fVar15 != 0) {
          for (; (fVar15 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        uVar11 = uVar12 << 6 | uVar11;
        uVar10 = uVar11 & 0xffffffff;
        if (199 < uVar10) break;
      }
      goto LAB_011742a0;
    }
  }
  peVar5 = (edata_t *)0x0;
LAB_011742a0:
  if (alignment < 0x1001) {
    return peVar5;
  }
  if (peVar5 != (edata_t *)0x0) {
    return peVar5;
  }
  sVar4 = duckdb_je_sz_psz_quantize_ceil(esize);
  if (sVar4 < 0x7000000000000001) {
    uVar10 = sVar4 - 1;
    if (uVar10 == 0) {
      uVar8 = 0x40;
    }
    else {
      lVar1 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar8 = (uint)lVar1 ^ 0x3f;
    }
    iVar13 = 0x32 - uVar8;
    if (0x32 < uVar8) {
      iVar13 = 0;
    }
    bVar7 = 0xc;
    if (0x4000 < sVar4) {
      bVar7 = (char)iVar13 + 0xb;
    }
    uVar8 = ((uint)(uVar10 >> (bVar7 & 0x3f)) & 3) + iVar13 * 4;
  }
  else {
    uVar8 = 199;
  }
  sVar4 = duckdb_je_sz_psz_quantize_ceil(uVar16);
  if (sVar4 < 0x7000000000000001) {
    uVar16 = sVar4 - 1;
    if (uVar16 == 0) {
      uVar9 = 0x40;
    }
    else {
      lVar1 = 0x3f;
      if (uVar16 != 0) {
        for (; uVar16 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar9 = (uint)lVar1 ^ 0x3f;
    }
    iVar13 = 0x32 - uVar9;
    if (0x32 < uVar9) {
      iVar13 = 0;
    }
    bVar7 = 0xc;
    if (0x4000 < sVar4) {
      bVar7 = (char)iVar13 + 0xb;
    }
    uVar9 = ((uint)(uVar16 >> (bVar7 & 0x3f)) & 3) + iVar13 * 4;
  }
  else {
    uVar9 = 199;
  }
  uVar10 = (ulong)(uVar8 >> 6);
  uVar16 = (eset->bitmap[uVar10] >> ((byte)uVar8 & 0x3f)) << ((byte)uVar8 & 0x3f);
  do {
    if (uVar16 != 0) {
      uVar6 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      uVar6 = uVar10 << 6 | uVar6;
LAB_0117439c:
      if ((uint)uVar6 < uVar9) {
        do {
          peVar5 = duckdb_je_edata_heap_first(&eset->bins[uVar6 & 0xffffffff].heap);
          uVar10 = (ulong)peVar5->e_addr & 0xfffffffffffff000;
          uVar16 = (uVar3 - 1) + uVar10 & -uVar3;
          if (((uVar10 <= uVar16) &&
              (uVar10 = ((peVar5->field_2).e_size_esn & 0xfffffffffffff000) + uVar10,
              uVar16 < uVar10)) && (esize <= uVar10 - uVar16)) {
            return peVar5;
          }
          uVar16 = (uVar6 & 0xffffffff) + 1;
          uVar10 = uVar16 >> 6;
          bVar7 = (byte)uVar16;
          uVar16 = (eset->bitmap[uVar10] >> (bVar7 & 0x3f)) << (bVar7 & 0x3f);
          while (uVar16 == 0) {
            if (uVar10 == 3) {
              uVar6 = 200;
              goto LAB_01174440;
            }
            lVar1 = uVar10 + 1;
            uVar10 = uVar10 + 1;
            uVar16 = eset->bitmap[lVar1];
          }
          uVar6 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          uVar6 = uVar10 << 6 | uVar6;
LAB_01174440:
        } while ((uint)uVar6 < uVar9);
      }
      return (edata_t *)0x0;
    }
    if (uVar10 == 3) {
      uVar6 = 200;
      goto LAB_0117439c;
    }
    uVar16 = eset->bitmap[uVar10 + 1];
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

edata_t *
eset_fit(eset_t *eset, size_t esize, size_t alignment, bool exact_only,
    unsigned lg_max_fit) {
	size_t max_size = esize + PAGE_CEILING(alignment) - PAGE;
	/* Beware size_t wrap-around. */
	if (max_size < esize) {
		return NULL;
	}

	edata_t *edata = eset_first_fit(eset, max_size, exact_only, lg_max_fit);

	if (alignment > PAGE && edata == NULL) {
		/*
		 * max_size guarantees the alignment requirement but is rather
		 * pessimistic.  Next we try to satisfy the aligned allocation
		 * with sizes in [esize, max_size).
		 */
		edata = eset_fit_alignment(eset, esize, max_size, alignment);
	}

	return edata;
}